

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectNumberF64(JlDataObject *NumberObject,double *pNumberF64)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  double *pNumberF64_local;
  JlDataObject *NumberObject_local;
  
  if ((NumberObject == (JlDataObject *)0x0) || (pNumberF64 == (double *)0x0)) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else if ((NumberObject->Type == JL_DATA_TYPE_NUMBER) &&
          ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_FLOAT)) {
    *pNumberF64 = (double)(NumberObject->field_2).Number.field_1;
    local_1c = JL_STATUS_SUCCESS;
  }
  else if ((NumberObject->Type == JL_DATA_TYPE_NUMBER) &&
          ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_UNSIGNED)) {
    uVar1 = *(undefined8 *)((long)&NumberObject->field_2 + 8);
    auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    *pNumberF64 = (auVar2._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    local_1c = JL_STATUS_SUCCESS;
  }
  else if ((NumberObject->Type == JL_DATA_TYPE_NUMBER) &&
          ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_SIGNED)) {
    *pNumberF64 = (double)(long)(NumberObject->field_2).List.ListHead;
    local_1c = JL_STATUS_SUCCESS;
  }
  else {
    *pNumberF64 = 0.0;
    local_1c = JL_STATUS_WRONG_TYPE;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlGetObjectNumberF64
    (
        JlDataObject const* NumberObject,
        double*             pNumberF64
    )
{
    JL_STATUS jlStatus;

    if(     NULL != NumberObject
        &&  NULL != pNumberF64 )
    {
        if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_FLOAT == NumberObject->Number.Type )
        {
            // Number stored as a double. Easy.
            *pNumberF64 = NumberObject->Number.f64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type )
        {
            // Convert from uint64_t to double. Precision may be lost.
            *pNumberF64 = (double)(NumberObject->Number.u64);
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_SIGNED == NumberObject->Number.Type )
        {
            // Convert from int64_t to double. Precision may be lost.
            *pNumberF64 = (double)(NumberObject->Number.s64);
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            *pNumberF64 = 0.0;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}